

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCopiesAndBlittingTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::api::anon_unknown_0::BlittingImages::checkTestResult
          (TestStatus *__return_storage_ptr__,BlittingImages *this,ConstPixelBufferAccess *result)

{
  TextureFormat TVar1;
  ChannelType type;
  bool bVar2;
  ConstPixelBufferAccess unclampedExpected;
  string failMessage;
  TextureFormat sourceFormat;
  ConstPixelBufferAccess depthResult;
  ConstPixelBufferAccess clampedExpected;
  ConstPixelBufferAccess local_110;
  long *local_e8;
  long local_e0;
  long local_d8 [2];
  PixelBufferAccess local_c8;
  ConstPixelBufferAccess local_a0;
  ConstPixelBufferAccess local_78;
  PixelBufferAccess local_50;
  
  local_e8 = local_d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e8,"Result image is incorrect","");
  type = (result->m_format).type;
  if ((this->super_CopiesAndBlittingTestInstance).m_params.field_3.filter == VK_FILTER_LINEAR) {
    bVar2 = tcu::isCombinedDepthStencilType(type);
    if (bVar2) {
      bVar2 = tcu::hasDepthComponent((result->m_format).order);
      if (bVar2) {
        tcu::getEffectiveDepthStencilAccess(&local_a0,result,MODE_DEPTH);
        tcu::TextureLevel::getAccess
                  (&local_c8,
                   (this->super_CopiesAndBlittingTestInstance).m_expectedTextureLevel.
                   super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.
                   m_data.ptr);
        tcu::getEffectiveDepthStencilAccess((PixelBufferAccess *)&local_110,&local_c8,MODE_DEPTH);
        local_78.m_format = local_110.m_format;
        local_78.m_size.m_data[0] = local_110.m_size.m_data[0];
        local_78.m_size.m_data[1] = local_110.m_size.m_data[1];
        local_78.m_size.m_data[2] = local_110.m_size.m_data[2];
        local_78.m_pitch.m_data[0] = local_110.m_pitch.m_data[0];
        local_78.m_pitch.m_data[1] = local_110.m_pitch.m_data[1];
        local_78.m_pitch.m_data[2] = local_110.m_pitch.m_data[2];
        local_78.m_data = local_110.m_data;
        tcu::TextureLevel::getAccess
                  (&local_50,
                   (this->m_unclampedExpectedTextureLevel).
                   super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.
                   m_data.ptr);
        tcu::getEffectiveDepthStencilAccess(&local_c8,&local_50,MODE_DEPTH);
        local_110.m_format = local_c8.super_ConstPixelBufferAccess.m_format;
        local_110.m_size.m_data[0] = local_c8.super_ConstPixelBufferAccess.m_size.m_data[0];
        local_110.m_size.m_data[1] = local_c8.super_ConstPixelBufferAccess.m_size.m_data[1];
        local_110.m_size.m_data[2] = local_c8.super_ConstPixelBufferAccess.m_size.m_data[2];
        local_110.m_pitch.m_data[0] = local_c8.super_ConstPixelBufferAccess.m_pitch.m_data[0];
        local_110.m_pitch.m_data[1] = local_c8.super_ConstPixelBufferAccess.m_pitch.m_data[1];
        local_110.m_pitch.m_data[2] = local_c8.super_ConstPixelBufferAccess.m_pitch.m_data[2];
        local_110.m_data = local_c8.super_ConstPixelBufferAccess.m_data;
        local_50.super_ConstPixelBufferAccess.m_format =
             ::vk::mapVkFormat((this->super_CopiesAndBlittingTestInstance).m_params.src.image.format
                              );
        local_c8.super_ConstPixelBufferAccess.m_format =
             tcu::getEffectiveDepthStencilTextureFormat((TextureFormat *)&local_50,MODE_DEPTH);
        bVar2 = checkLinearFilteredResult
                          (this,&local_a0,&local_78,&local_110,(TextureFormat *)&local_c8);
        if (!bVar2) {
          __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
          (__return_storage_ptr__->m_description)._M_dataplus._M_p =
               (pointer)&(__return_storage_ptr__->m_description).field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&__return_storage_ptr__->m_description,local_e8,
                     local_e0 + (long)local_e8);
          if (!bVar2) goto LAB_0047a45a;
        }
      }
      bVar2 = tcu::hasStencilComponent((result->m_format).order);
      if (bVar2) {
        tcu::getEffectiveDepthStencilAccess(&local_a0,result,MODE_STENCIL);
        tcu::TextureLevel::getAccess
                  (&local_c8,
                   (this->super_CopiesAndBlittingTestInstance).m_expectedTextureLevel.
                   super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.
                   m_data.ptr);
        tcu::getEffectiveDepthStencilAccess((PixelBufferAccess *)&local_110,&local_c8,MODE_STENCIL);
        local_78.m_format = local_110.m_format;
        local_78.m_size.m_data[0] = local_110.m_size.m_data[0];
        local_78.m_size.m_data[1] = local_110.m_size.m_data[1];
        local_78.m_size.m_data[2] = local_110.m_size.m_data[2];
        local_78.m_pitch.m_data[0] = local_110.m_pitch.m_data[0];
        local_78.m_pitch.m_data[1] = local_110.m_pitch.m_data[1];
        local_78.m_pitch.m_data[2] = local_110.m_pitch.m_data[2];
        local_78.m_data = local_110.m_data;
        tcu::TextureLevel::getAccess
                  (&local_50,
                   (this->m_unclampedExpectedTextureLevel).
                   super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.
                   m_data.ptr);
        tcu::getEffectiveDepthStencilAccess(&local_c8,&local_50,MODE_STENCIL);
        local_110.m_format = local_c8.super_ConstPixelBufferAccess.m_format;
        local_110.m_size.m_data[0] = local_c8.super_ConstPixelBufferAccess.m_size.m_data[0];
        local_110.m_size.m_data[1] = local_c8.super_ConstPixelBufferAccess.m_size.m_data[1];
        local_110.m_size.m_data[2] = local_c8.super_ConstPixelBufferAccess.m_size.m_data[2];
        local_110.m_pitch.m_data[0] = local_c8.super_ConstPixelBufferAccess.m_pitch.m_data[0];
        local_110.m_pitch.m_data[1] = local_c8.super_ConstPixelBufferAccess.m_pitch.m_data[1];
        local_110.m_pitch.m_data[2] = local_c8.super_ConstPixelBufferAccess.m_pitch.m_data[2];
        local_110.m_data = local_c8.super_ConstPixelBufferAccess.m_data;
        local_50.super_ConstPixelBufferAccess.m_format =
             ::vk::mapVkFormat((this->super_CopiesAndBlittingTestInstance).m_params.src.image.format
                              );
        local_c8.super_ConstPixelBufferAccess.m_format =
             tcu::getEffectiveDepthStencilTextureFormat((TextureFormat *)&local_50,MODE_STENCIL);
        bVar2 = checkLinearFilteredResult
                          (this,&local_a0,&local_78,&local_110,(TextureFormat *)&local_c8);
        if (!bVar2) {
          __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
          (__return_storage_ptr__->m_description)._M_dataplus._M_p =
               (pointer)&(__return_storage_ptr__->m_description).field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&__return_storage_ptr__->m_description,local_e8,
                     local_e0 + (long)local_e8);
          goto LAB_0047a3a0;
        }
      }
    }
    else {
      local_110.m_format =
           ::vk::mapVkFormat((this->super_CopiesAndBlittingTestInstance).m_params.src.image.format);
      tcu::TextureLevel::getAccess
                ((PixelBufferAccess *)&local_a0,
                 (this->super_CopiesAndBlittingTestInstance).m_expectedTextureLevel.
                 super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.m_data.
                 ptr);
      tcu::TextureLevel::getAccess
                ((PixelBufferAccess *)&local_78,
                 (this->m_unclampedExpectedTextureLevel).
                 super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.m_data.
                 ptr);
      bVar2 = checkLinearFilteredResult(this,result,&local_a0,&local_78,&local_110.m_format);
      if (!bVar2) {
        __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
        (__return_storage_ptr__->m_description)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->m_description).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->m_description,local_e8,
                   local_e0 + (long)local_e8);
LAB_0047a3a0:
        if (bVar2 == false) goto LAB_0047a45a;
      }
    }
  }
  else {
    bVar2 = tcu::isCombinedDepthStencilType(type);
    if (bVar2) {
      bVar2 = tcu::hasDepthComponent((result->m_format).order);
      if (bVar2) {
        tcu::getEffectiveDepthStencilAccess(&local_a0,result,MODE_DEPTH);
        tcu::TextureLevel::getAccess
                  (&local_c8,
                   (this->super_CopiesAndBlittingTestInstance).m_sourceTextureLevel.
                   super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.
                   m_data.ptr);
        tcu::getEffectiveDepthStencilAccess((PixelBufferAccess *)&local_110,&local_c8,MODE_DEPTH);
        local_78.m_format = local_110.m_format;
        local_78.m_size.m_data[0] = local_110.m_size.m_data[0];
        local_78.m_size.m_data[1] = local_110.m_size.m_data[1];
        local_78.m_size.m_data[2] = local_110.m_size.m_data[2];
        local_78.m_pitch.m_data[0] = local_110.m_pitch.m_data[0];
        local_78.m_pitch.m_data[1] = local_110.m_pitch.m_data[1];
        local_78.m_pitch.m_data[2] = local_110.m_pitch.m_data[2];
        local_78.m_data = local_110.m_data;
        bVar2 = checkNearestFilteredResult(this,&local_a0,&local_78);
        if (!bVar2) {
          __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
          (__return_storage_ptr__->m_description)._M_dataplus._M_p =
               (pointer)&(__return_storage_ptr__->m_description).field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&__return_storage_ptr__->m_description,local_e8,
                     local_e0 + (long)local_e8);
          if (!bVar2) goto LAB_0047a45a;
        }
      }
      bVar2 = tcu::hasStencilComponent((result->m_format).order);
      if (bVar2) {
        tcu::getEffectiveDepthStencilAccess(&local_a0,result,MODE_STENCIL);
        tcu::TextureLevel::getAccess
                  (&local_c8,
                   (this->super_CopiesAndBlittingTestInstance).m_sourceTextureLevel.
                   super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.
                   m_data.ptr);
        tcu::getEffectiveDepthStencilAccess((PixelBufferAccess *)&local_110,&local_c8,MODE_STENCIL);
        local_78.m_format = local_110.m_format;
        local_78.m_size.m_data[0] = local_110.m_size.m_data[0];
        local_78.m_size.m_data[1] = local_110.m_size.m_data[1];
        local_78.m_size.m_data[2] = local_110.m_size.m_data[2];
        local_78.m_pitch.m_data[0] = local_110.m_pitch.m_data[0];
        local_78.m_pitch.m_data[1] = local_110.m_pitch.m_data[1];
        local_78.m_pitch.m_data[2] = local_110.m_pitch.m_data[2];
        local_78.m_data = local_110.m_data;
        bVar2 = checkNearestFilteredResult(this,&local_a0,&local_78);
        if (!bVar2) {
          __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
          (__return_storage_ptr__->m_description)._M_dataplus._M_p =
               (pointer)&(__return_storage_ptr__->m_description).field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&__return_storage_ptr__->m_description,local_e8,
                     local_e0 + (long)local_e8);
          goto LAB_0047a3a0;
        }
      }
    }
    else {
      tcu::TextureLevel::getAccess
                ((PixelBufferAccess *)&local_a0,
                 (this->super_CopiesAndBlittingTestInstance).m_sourceTextureLevel.
                 super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.m_data.
                 ptr);
      bVar2 = checkNearestFilteredResult(this,result,&local_a0);
      if (!bVar2) {
        __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
        (__return_storage_ptr__->m_description)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->m_description).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->m_description,local_e8,
                   local_e0 + (long)local_e8);
        goto LAB_0047a45a;
      }
    }
  }
  TVar1 = (TextureFormat)(local_a0.m_size.m_data + 2);
  local_a0.m_format = TVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"Pass","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_a0.m_format,
             (undefined1 *)(local_a0.m_size.m_data._0_8_ + (long)local_a0.m_format));
  if (local_a0.m_format != TVar1) {
    operator_delete((void *)local_a0.m_format,local_a0._16_8_ + 1);
  }
LAB_0047a45a:
  if (local_e8 != local_d8) {
    operator_delete(local_e8,local_d8[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus BlittingImages::checkTestResult (tcu::ConstPixelBufferAccess result)
{
	DE_ASSERT(m_params.filter == VK_FILTER_NEAREST || m_params.filter == VK_FILTER_LINEAR);
	const std::string failMessage("Result image is incorrect");

	if (m_params.filter == VK_FILTER_LINEAR)
	{
		if (tcu::isCombinedDepthStencilType(result.getFormat().type))
		{
			if (tcu::hasDepthComponent(result.getFormat().order))
			{
				const tcu::Sampler::DepthStencilMode	mode				= tcu::Sampler::MODE_DEPTH;
				const tcu::ConstPixelBufferAccess		depthResult			= tcu::getEffectiveDepthStencilAccess(result, mode);
				const tcu::ConstPixelBufferAccess		clampedExpected		= tcu::getEffectiveDepthStencilAccess(m_expectedTextureLevel->getAccess(), mode);
				const tcu::ConstPixelBufferAccess		unclampedExpected	= tcu::getEffectiveDepthStencilAccess(m_unclampedExpectedTextureLevel->getAccess(), mode);
				const tcu::TextureFormat				sourceFormat		= tcu::getEffectiveDepthStencilTextureFormat(mapVkFormat(m_params.src.image.format), mode);

				if (!checkLinearFilteredResult(depthResult, clampedExpected, unclampedExpected, sourceFormat))
					return tcu::TestStatus::fail(failMessage);
			}

			if (tcu::hasStencilComponent(result.getFormat().order))
			{
				const tcu::Sampler::DepthStencilMode	mode				= tcu::Sampler::MODE_STENCIL;
				const tcu::ConstPixelBufferAccess		stencilResult		= tcu::getEffectiveDepthStencilAccess(result, mode);
				const tcu::ConstPixelBufferAccess		clampedExpected		= tcu::getEffectiveDepthStencilAccess(m_expectedTextureLevel->getAccess(), mode);
				const tcu::ConstPixelBufferAccess		unclampedExpected	= tcu::getEffectiveDepthStencilAccess(m_unclampedExpectedTextureLevel->getAccess(), mode);
				const tcu::TextureFormat				sourceFormat		= tcu::getEffectiveDepthStencilTextureFormat(mapVkFormat(m_params.src.image.format), mode);

				if (!checkLinearFilteredResult(stencilResult, clampedExpected, unclampedExpected, sourceFormat))
					return tcu::TestStatus::fail(failMessage);
			}
		}
		else
		{
			const tcu::TextureFormat	sourceFormat	= mapVkFormat(m_params.src.image.format);

			if (!checkLinearFilteredResult(result, m_expectedTextureLevel->getAccess(), m_unclampedExpectedTextureLevel->getAccess(), sourceFormat))
				return tcu::TestStatus::fail(failMessage);
		}
	}
	else // NEAREST filtering
	{
		if (tcu::isCombinedDepthStencilType(result.getFormat().type))
		{
			if (tcu::hasDepthComponent(result.getFormat().order))
			{
				const tcu::Sampler::DepthStencilMode	mode			= tcu::Sampler::MODE_DEPTH;
				const tcu::ConstPixelBufferAccess		depthResult		= tcu::getEffectiveDepthStencilAccess(result, mode);
				const tcu::ConstPixelBufferAccess		depthSource		= tcu::getEffectiveDepthStencilAccess(m_sourceTextureLevel->getAccess(), mode);

				if (!checkNearestFilteredResult(depthResult, depthSource))
					return tcu::TestStatus::fail(failMessage);
			}

			if (tcu::hasStencilComponent(result.getFormat().order))
			{
				const tcu::Sampler::DepthStencilMode	mode			= tcu::Sampler::MODE_STENCIL;
				const tcu::ConstPixelBufferAccess		stencilResult	= tcu::getEffectiveDepthStencilAccess(result, mode);
				const tcu::ConstPixelBufferAccess		stencilSource	= tcu::getEffectiveDepthStencilAccess(m_sourceTextureLevel->getAccess(), mode);

				if (!checkNearestFilteredResult(stencilResult, stencilSource))
					return tcu::TestStatus::fail(failMessage);
			}
		}
		else
		{
			if (!checkNearestFilteredResult(result, m_sourceTextureLevel->getAccess()))
				return tcu::TestStatus::fail(failMessage);
		}
	}

	return tcu::TestStatus::pass("Pass");
}